

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::removeWatch(Solver *this,Literal *p,ClauseHead *h)

{
  bool bVar1;
  uint32 n;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this_00;
  ClauseHead *in_RDX;
  Literal *in_RSI;
  EqHead in_RDI;
  WatchList *pList;
  Solver *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *__last;
  ClauseHead *c;
  EqHead in_stack_ffffffffffffffc8;
  Literal in_stack_ffffffffffffffd0;
  
  bVar1 = validWatch(in_stack_ffffffffffffffa8,
                     (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if (bVar1) {
    c = (ClauseHead *)&in_RDI.head[0xb].info_;
    n = Literal::id(in_RSI);
    this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
              bk_lib::
              pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
              ::operator[]((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                            *)c,n);
    if ((in_RDI.head[5].field_0.shared_ == (SharedLiterals *)0x0) ||
       (bVar1 = Dirty::add((Dirty *)in_stack_ffffffffffffffc8.head,in_stack_ffffffffffffffd0,
                           (WatchList *)in_RDI.head,c), !bVar1)) {
      __last = this_00;
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
                ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1e9929);
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_end(this_00);
      ClauseWatch::EqHead::EqHead((EqHead *)&stack0xffffffffffffffc8,in_RDX);
      std::find_if<Clasp::ClauseWatch*,Clasp::ClauseWatch::EqHead>
                ((ClauseWatch *)c,(ClauseWatch *)__last,in_RDI);
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::erase_left
                ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)in_RDI.head,
                 (left_iterator)c);
    }
  }
  return;
}

Assistant:

void Solver::removeWatch(const Literal& p, ClauseHead* h) {
	if (!validWatch(p)) { return; }
	WatchList& pList = watches_[p.id()];
	if (!lazyRem_ || !lazyRem_->add(p, pList, h)) {
		pList.erase_left(std::find_if(pList.left_begin(), pList.left_end(), ClauseWatch::EqHead(h)));
	}
}